

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

int __thiscall FTOutline::close(FTOutline *this,int __fd)

{
  int index;
  FTOutline *this_local;
  
  (this->ft).contours_flag[(this->ft).n_contours] = '\0';
  if ((this->ft).n_contours == 0) {
    index = 0;
  }
  else {
    index = (this->ft).contours[(this->ft).n_contours + -1] + 1;
  }
  if ((this->ft).n_points == index) {
    this->closed = false;
  }
  else {
    (this->ft).points[(this->ft).n_points].x = (this->ft).points[index].x;
    (this->ft).points[(this->ft).n_points].y = (this->ft).points[index].y;
    (this->ft).tags[(this->ft).n_points] = '\x01';
    (this->ft).n_points = (this->ft).n_points + 1;
  }
  return (int)this;
}

Assistant:

void FTOutline::close()
{
    assert(ft.n_points <= SHRT_MAX - 1);

    // mark the contour as a close path.
    ft.contours_flag[ft.n_contours] = 0;

    int index;
    if (ft.n_contours) {
        index = ft.contours[ft.n_contours - 1] + 1;
    } else {
        index = 0;
    }

    // make sure atleast 1 point exists in the segment.
    if (ft.n_points == index) {
        closed = false;
        return;
    }

    ft.points[ft.n_points].x = ft.points[index].x;
    ft.points[ft.n_points].y = ft.points[index].y;
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}